

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

string * capitalize(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  const_iterator it;
  ostringstream oss;
  string *str_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
  local_198._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_1a0._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_198,&local_1a0);
    if (!bVar1) break;
    local_1a8._M_current = (char *)std::__cxx11::string::begin();
    bVar1 = __gnu_cxx::operator==(&local_198,&local_1a8);
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_198);
      iVar2 = toupper((int)*pcVar3);
      std::operator<<((ostream *)&it,(char)iVar2);
    }
    else {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_198);
      iVar2 = tolower((int)*pcVar3);
      std::operator<<((ostream *)&it,(char)iVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_198);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string& str)
{
	std::ostringstream oss;
	for (auto it = str.begin(); it != str.end(); ++it)
	{
		if (it == str.begin())
		{
			oss << static_cast<char>(toupper(*it));
		}
		else
		{
			oss << static_cast<char>(tolower(*it));
		}
	}
	return oss.str();
}